

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O1

void __thiscall BeliefSparse::InnerProduct(BeliefSparse *this)

{
  VectorSet *in_RDX;
  long *in_RSI;
  
  InnerProduct((vector<double,_std::allocator<double>_> *)this,
               (BeliefSparse *)((long)in_RSI + *(long *)(*in_RSI + -0x98)),in_RDX);
  return;
}

Assistant:

vector<double> BeliefSparse::InnerProduct(const VectorSet &v) const
{
    vector<double> values(v.size1());

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        x=0;
        for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
            x+=(*it)*v(k,it.index());
        values[k]=x;
    }

    return(values);
}